

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O2

void InternalSphere::Statistics
               (dgSphere *sphere,dgVector *eigenValues,dgVector *scaleVector,HaF32 *vertex,
               HaI32 vertexCount,HaI32 stride)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  dgSphere *this;
  dgMatrix *initialGuess;
  uint uVar8;
  float *pfVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double local_108;
  double local_100;
  double local_f8;
  dgBigVector local_c8;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  dgSphere *local_78;
  dgVector *local_70;
  double local_68;
  undefined8 uStack_60;
  dgTemplateVector<double> local_58;
  
  pfVar9 = (float *)(vertex + 2);
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  uVar8 = ~(vertexCount >> 0x1f) & vertexCount;
  local_f8 = 0.0;
  local_108 = 0.0;
  local_100 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_78 = sphere;
  local_70 = eigenValues;
  while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
    uVar1 = (scaleVector->super_dgTemplateVector<float>).m_x;
    uVar2 = (scaleVector->super_dgTemplateVector<float>).m_y;
    auVar15._0_4_ = (float)*(undefined8 *)(pfVar9 + -2) * (float)uVar1;
    auVar15._4_4_ = (float)((ulong)*(undefined8 *)(pfVar9 + -2) >> 0x20) * (float)uVar2;
    auVar15._8_8_ = 0;
    fVar3 = *pfVar9 * (scaleVector->super_dgTemplateVector<float>).m_z;
    auVar18 = vmovshdup_avx(auVar15);
    fVar13 = auVar18._0_4_;
    dgBigVector::dgBigVector
              (&local_c8,(HaF64)(double)auVar15._0_4_,(HaF64)(double)fVar13,(HaF64)(double)fVar3,0.0
              );
    local_88 = local_88 + local_c8.super_dgTemplateVector<double>.m_x;
    dStack_80 = dStack_80 + local_c8.super_dgTemplateVector<double>.m_y;
    local_100 = local_100 + local_c8.super_dgTemplateVector<double>.m_z;
    dgBigVector::dgBigVector
              (&local_c8,(HaF64)(double)(auVar15._0_4_ * auVar15._0_4_),
               (HaF64)(double)(fVar13 * fVar13),(HaF64)(double)(fVar3 * fVar3),0.0);
    local_a8 = local_a8 + local_c8.super_dgTemplateVector<double>.m_x;
    dStack_a0 = dStack_a0 + local_c8.super_dgTemplateVector<double>.m_y;
    local_f8 = local_f8 + local_c8.super_dgTemplateVector<double>.m_z;
    dgBigVector::dgBigVector
              (&local_c8,(HaF64)(double)(auVar15._0_4_ * fVar13),
               (HaF64)(double)(auVar15._0_4_ * fVar3),(HaF64)(double)(fVar13 * fVar3),0.0);
    pfVar9 = pfVar9 + stride;
    local_98 = local_98 + local_c8.super_dgTemplateVector<double>.m_x;
    dStack_90 = dStack_90 + local_c8.super_dgTemplateVector<double>.m_y;
    local_108 = local_108 + local_c8.super_dgTemplateVector<double>.m_z;
  }
  dVar14 = 1.0 / (double)vertexCount;
  local_58.m_z = dVar14 * local_f8;
  uStack_60 = 0;
  local_58.m_x = dVar14 * local_a8;
  local_58.m_y = dVar14 * dStack_a0;
  local_58.m_w = 0.0;
  local_68 = dVar14;
  dgBigVector::dgBigVector(&local_c8,&local_58);
  dVar6 = local_c8.super_dgTemplateVector<double>.m_z;
  dVar4 = local_c8.super_dgTemplateVector<double>.m_y;
  local_58.m_x = dVar14 * local_98;
  local_58.m_y = dVar14 * dStack_90;
  local_a8 = local_c8.super_dgTemplateVector<double>.m_x;
  local_58.m_z = local_68 * local_108;
  local_58.m_w = 0.0;
  dgBigVector::dgBigVector(&local_c8,&local_58);
  dVar7 = local_c8.super_dgTemplateVector<double>.m_z;
  dVar5 = local_c8.super_dgTemplateVector<double>.m_y;
  local_58.m_x = dVar14 * local_88;
  local_58.m_y = dVar14 * dStack_80;
  local_98 = local_c8.super_dgTemplateVector<double>.m_x;
  local_58.m_z = local_68 * local_100;
  local_58.m_w = 0.0;
  dgBigVector::dgBigVector(&local_c8,&local_58);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_c8.super_dgTemplateVector<double>.m_y;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar4;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_c8.super_dgTemplateVector<double>.m_z;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_c8.super_dgTemplateVector<double>.m_x;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_a8;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar5;
  auVar18 = vfnmadd231sd_fma(auVar18,auVar16,auVar16);
  auVar21 = vfnmadd231sd_fma(auVar21,auVar11,auVar11);
  auVar22 = vfnmadd231sd_fma(auVar22,auVar17,auVar11);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar6;
  auVar19 = vfnmadd231sd_fma(auVar19,auVar17,auVar17);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_98;
  auVar11 = vfnmadd231sd_fma(auVar20,auVar11,auVar16);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar7;
  auVar12 = vfnmadd231sd_fma(auVar12,auVar16,auVar17);
  local_88 = (double)CONCAT44(local_88._4_4_,(float)auVar11._0_8_);
  dgVector::dgVector((dgVector *)&local_c8,(HaF32)(float)auVar21._0_8_,(HaF32)(float)auVar11._0_8_,
                     (HaF32)(float)auVar22._0_8_,0.0);
  this = local_78;
  *(double *)&(local_78->super_dgMatrix).m_front.super_dgTemplateVector<float> =
       local_c8.super_dgTemplateVector<double>.m_x;
  *(double *)&(local_78->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z =
       local_c8.super_dgTemplateVector<double>.m_y;
  dgVector::dgVector((dgVector *)&local_c8,local_88._0_4_,(HaF32)(float)auVar18._0_8_,
                     (HaF32)(float)auVar12._0_8_,0.0);
  *(double *)&(this->super_dgMatrix).m_up.super_dgTemplateVector<float> =
       local_c8.super_dgTemplateVector<double>.m_x;
  *(double *)&(this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z =
       local_c8.super_dgTemplateVector<double>.m_y;
  dgVector::dgVector((dgVector *)&local_c8,(HaF32)(float)auVar22._0_8_,(HaF32)(float)auVar12._0_8_,
                     (HaF32)(float)auVar19._0_8_,0.0);
  *(double *)&(this->super_dgMatrix).m_right.super_dgTemplateVector<float> =
       local_c8.super_dgTemplateVector<double>.m_x;
  *(double *)&(this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z =
       local_c8.super_dgTemplateVector<double>.m_y;
  initialGuess = dgGetIdentityMatrix();
  dgMatrix::EigenVectors(&this->super_dgMatrix,local_70,initialGuess);
  return;
}

Assistant:

static void Statistics (dgSphere &sphere, dgVector &eigenValues, dgVector &scaleVector, const hacd::HaF32 vertex[], hacd::HaI32 vertexCount, hacd::HaI32 stride)
	{
		dgBigVector var (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgBigVector cov (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgBigVector massCenter (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
	
		const hacd::HaF32* ptr = vertex;
		for (hacd::HaI32 i = 0; i < vertexCount; i ++) {
			hacd::HaF32 x = ptr[0] * scaleVector.m_x;
			hacd::HaF32 y = ptr[1] * scaleVector.m_y;
			hacd::HaF32 z = ptr[2] * scaleVector.m_z;
			ptr += stride;
			massCenter += dgBigVector (x, y, z, hacd::HaF32 (0.0f));
			var += dgBigVector (x * x, y * y, z * z, hacd::HaF32 (0.0f));
			cov += dgBigVector (x * y, x * z, y * z, hacd::HaF32 (0.0f));
		}
	
		hacd::HaF64 k = hacd::HaF64 (1.0) / vertexCount;
		var = var.Scale (k);
		cov = cov.Scale (k);
		massCenter = massCenter.Scale (k);
	
		hacd::HaF64 Ixx = var.m_x - massCenter.m_x * massCenter.m_x;
		hacd::HaF64 Iyy = var.m_y - massCenter.m_y * massCenter.m_y;
		hacd::HaF64 Izz = var.m_z - massCenter.m_z * massCenter.m_z;
	
		hacd::HaF64 Ixy = cov.m_x - massCenter.m_x * massCenter.m_y;
		hacd::HaF64 Ixz = cov.m_y - massCenter.m_x * massCenter.m_z;
		hacd::HaF64 Iyz = cov.m_z - massCenter.m_y * massCenter.m_z;
	
		sphere.m_front = dgVector (hacd::HaF32(Ixx), hacd::HaF32(Ixy), hacd::HaF32(Ixz), hacd::HaF32 (0.0f));
		sphere.m_up    = dgVector (hacd::HaF32(Ixy), hacd::HaF32(Iyy), hacd::HaF32(Iyz), hacd::HaF32 (0.0f));
		sphere.m_right = dgVector (hacd::HaF32(Ixz), hacd::HaF32(Iyz), hacd::HaF32(Izz), hacd::HaF32 (0.0f));
 		sphere.EigenVectors (eigenValues);
	}